

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.h
# Opt level: O2

void __thiscall
vkb::Result<vkb::detail::SurfaceSupportDetails>::destroy
          (Result<vkb::detail::SurfaceSupportDetails> *this)

{
  if (this->m_init != true) {
    return;
  }
  std::_Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::~_Vector_base
            (&(this->field_0).m_value.present_modes.
              super__Vector_base<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>);
  std::_Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>::~_Vector_base
            (&(this->field_0).m_value.formats.
              super__Vector_base<VkSurfaceFormatKHR,_std::allocator<VkSurfaceFormatKHR>_>);
  return;
}

Assistant:

void destroy() {
        if (m_init) m_value.~T();
    }